

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O3

void __thiscall
duckdb::TextTreeRenderer::SplitStringBuffer
          (TextTreeRenderer *this,string *source,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *result)

{
  byte bVar1;
  char *s;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  size_t pos;
  ulong local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_t local_50;
  char *local_48;
  ulong local_40;
  size_t local_38;
  
  local_50 = source->_M_string_length;
  if (local_50 != 0) {
    local_40 = (this->config).node_render_width - 2;
    local_48 = (source->_M_dataplus)._M_p;
    local_88 = 0;
    lVar6 = 0;
    uVar5 = 0;
    pos = 0;
    do {
      s = local_48;
      sVar4 = local_50;
      sVar3 = Utf8Proc::RenderWidth(local_48,local_50,pos);
      sVar4 = Utf8Proc::NextGraphemeCluster(s,sVar4,pos);
      local_38 = sVar3;
      if (local_40 < sVar3 + lVar6) {
        if (uVar5 < local_88 + 8) {
          uVar5 = pos;
        }
        ::std::__cxx11::string::substr((ulong)&local_70,(ulong)source);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                   &local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        lVar6 = pos - uVar5;
        pos = uVar5;
        local_88 = uVar5;
      }
      bVar1 = (source->_M_dataplus)._M_p[pos];
      if (((char)bVar1 < '0') ||
         ((uVar2 = bVar1 - 0x3a, uVar2 < 0x27 && ((0x5e0000007fU >> ((ulong)uVar2 & 0x3f) & 1) != 0)
          ))) {
        uVar5 = pos;
      }
      lVar6 = lVar6 + local_38;
      pos = sVar4;
    } while (sVar4 < local_50);
    if (local_88 < local_50) {
      ::std::__cxx11::string::substr((ulong)&local_70,(ulong)source);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                 &local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void TextTreeRenderer::SplitStringBuffer(const string &source, vector<string> &result) {
	D_ASSERT(Utf8Proc::IsValid(source.c_str(), source.size()));
	const idx_t max_line_render_size = config.node_render_width - 2;
	// utf8 in prompt, get render width
	idx_t character_pos = 0;
	idx_t start_pos = 0;
	idx_t render_width = 0;
	idx_t last_possible_split = 0;

	const idx_t size = source.size();
	const char *input = source.c_str();

	while (character_pos < size) {
		size_t char_render_width = Utf8Proc::RenderWidth(input, size, character_pos);
		idx_t next_character_pos = Utf8Proc::NextGraphemeCluster(input, size, character_pos);

		// Does the next character make us exceed the line length?
		if (render_width + char_render_width > max_line_render_size) {
			if (start_pos + 8 > last_possible_split) {
				// The last character we can split on is one of the first 8 characters of the line
				// to not create very small lines we instead split on the current character
				last_possible_split = character_pos;
			}
			result.push_back(source.substr(start_pos, last_possible_split - start_pos));
			render_width = character_pos - last_possible_split;
			start_pos = last_possible_split;
			character_pos = last_possible_split;
		}
		// check if we can split on this character
		if (CanSplitOnThisChar(source[character_pos])) {
			last_possible_split = character_pos;
		}
		character_pos = next_character_pos;
		render_width += char_render_width;
	}
	if (size > start_pos) {
		// append the remainder of the input
		result.push_back(source.substr(start_pos, size - start_pos));
	}
}